

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_byte.h
# Opt level: O2

void RansDecSymbolInit(RansDecSymbol *s,uint32_t start,uint32_t freq)

{
  if (0x10000 < start) {
    __assert_fail("start <= (1 << 16)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                  ,0x103,"void RansDecSymbolInit(RansDecSymbol *, uint32_t, uint32_t)");
  }
  if (freq <= 0x10000 - start) {
    s->start = (uint16_t)start;
    s->freq = (uint16_t)freq;
    return;
  }
  __assert_fail("freq <= (1 << 16) - start",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                ,0x104,"void RansDecSymbolInit(RansDecSymbol *, uint32_t, uint32_t)");
}

Assistant:

static inline void RansDecSymbolInit(RansDecSymbol* s, uint32_t start, uint32_t freq)
{
    RansAssert(start <= (1 << 16));
    RansAssert(freq <= (1 << 16) - start);
    s->start = (uint16_t) start;
    s->freq = (uint16_t) freq;
}